

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

optional<metaf::CloudGroup> *
metaf::CloudGroup::parse
          (optional<metaf::CloudGroup> *__return_storage_ptr__,string *group,ReportPart reportPart,
          ReportMetadata *reportMetadata)

{
  int iVar1;
  Type TVar2;
  Type TVar3;
  
  if ((reportPart & ~HEADER) == METAR) {
    parseCloudLayerOrVertVis(__return_storage_ptr__,group);
  }
  else if (reportPart == RMK) {
    iVar1 = std::__cxx11::string::compare((char *)group);
    if (iVar1 == 0) {
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::CloudGroup>._M_payload = 6;
      (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.heightOrVertVis.
      distModifier = NONE;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x10) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x14) = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x20) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x24) = 0;
      (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.w.data = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x40) = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x4c) = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x58) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x5c) = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x68) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x6c) = 0;
      (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.incompleteText = CLD;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)group);
      if (iVar1 == 0) {
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::CloudGroup>._M_payload = 3;
        (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.heightOrVertVis.
        distModifier = NONE;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x10) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x14) = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x20) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x24) = 0;
        (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.w.data = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x40) = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x4c) = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x58) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x5c) = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x68) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x6c) = 0;
        (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.incompleteText = CIG;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)group);
        if (iVar1 == 0) {
          *(undefined8 *)
           &(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload
            .super__Optional_payload_base<metaf::CloudGroup>._M_payload = 5;
          (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.heightOrVertVis.
          distModifier = NONE;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x10) = 0
          ;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x14) = 0
          ;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x20) = 0
          ;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x24) = 0
          ;
          (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.w.data = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x40) = 0
          ;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x4c) = 0
          ;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x58) = 0
          ;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x5c) = 0
          ;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x68) = 0
          ;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x6c) = 0
          ;
          (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.incompleteText = CHINO
          ;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)group);
          TVar3 = BLOWING_SNOW;
          if (iVar1 != 0) {
            TVar3 = NOT_REPORTED;
          }
          iVar1 = std::__cxx11::string::compare((char *)group);
          TVar2 = BLOWING_DUST;
          if (iVar1 != 0) {
            TVar2 = TVar3;
          }
          iVar1 = std::__cxx11::string::compare((char *)group);
          TVar3 = BLOWING_SAND;
          if (iVar1 != 0) {
            TVar3 = TVar2;
          }
          iVar1 = std::__cxx11::string::compare((char *)group);
          TVar2 = VOLCANIC_ASH;
          if (iVar1 != 0) {
            TVar2 = TVar3;
          }
          iVar1 = std::__cxx11::string::compare((char *)group);
          TVar3 = SMOKE;
          if (iVar1 != 0) {
            TVar3 = TVar2;
          }
          iVar1 = std::__cxx11::string::compare((char *)group);
          TVar2 = FOG;
          if (iVar1 != 0) {
            TVar2 = TVar3;
          }
          if (TVar2 == NOT_REPORTED) {
            parseVariableCloudLayer(__return_storage_ptr__,group);
            return __return_storage_ptr__;
          }
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x6b) = 0
          ;
          *(undefined2 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x69) = 0
          ;
          *(undefined8 *)
           &(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload
            .super__Optional_payload_base<metaf::CloudGroup>._M_payload = 7;
          (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.heightOrVertVis.
          distModifier = NONE;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x10) = 0
          ;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x14) = 0
          ;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x20) = 0
          ;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x24) = 0
          ;
          (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.w.data = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x40) = 0
          ;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x4c) = 0
          ;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x58) = 0
          ;
          (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.cldTp.tp = TVar2;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x60) = 0
          ;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x68) = 0
          ;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::CloudGroup>._M_payload + 0x6c) = 0
          ;
          (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::CloudGroup>._M_payload._M_value.incompleteText =
               OBSCURATION;
        }
      }
    }
    (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::CloudGroup>._M_engaged = true;
  }
  else {
    (__return_storage_ptr__->super__Optional_base<metaf::CloudGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::CloudGroup>._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<CloudGroup> CloudGroup::parse(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	if (reportPart == ReportPart::METAR || reportPart == ReportPart::TAF)
		return parseCloudLayerOrVertVis(group);

	if (reportPart == ReportPart::RMK) {
		if (group == "CLD") return CloudGroup(Type::CLD_MISG, IncompleteText::CLD);
		if (group == "CIG") return CloudGroup(Type::CEILING, IncompleteText::CIG);
		if (group == "CHINO") return CloudGroup(Type::CHINO, IncompleteText::CHINO);
		if (const auto ct = CloudType::fromStringObscuration(group); ct.has_value()) {
			CloudGroup result = CloudGroup(Type::OBSCURATION, IncompleteText::OBSCURATION);
			result.cldTp = *ct;
			return result;
		}
		return parseVariableCloudLayer(group); 
	}
	return std::optional<CloudGroup>();
}